

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::changeEvent(QGroupBox *this,QEvent *ev)

{
  short sVar1;
  QGroupBoxPrivate *this_00;
  
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  sVar1 = *(short *)(ev + 8);
  if ((sVar1 == 0x61) || (sVar1 == 100)) {
    QGroupBoxPrivate::calculateFrame(this_00);
  }
  else if ((((sVar1 == 0x62) && (this_00->checkable == true)) &&
           ((((this->super_QWidget).data)->widget_attributes & 1) == 0)) &&
          (this_00->checked == false)) {
    QGroupBoxPrivate::_q_setChildrenEnabled(this_00,false);
  }
  QWidget::changeEvent(&this->super_QWidget,ev);
  return;
}

Assistant:

void QGroupBox::changeEvent(QEvent *ev)
{
    Q_D(QGroupBox);
    if (ev->type() == QEvent::EnabledChange) {
        if (d->checkable && isEnabled()) {
            // we are being enabled - disable children
            if (!d->checked)
                d->_q_setChildrenEnabled(false);
        }
    } else if (ev->type() == QEvent::FontChange
#ifdef Q_OS_MAC
               || ev->type() == QEvent::MacSizeChange
#endif
               || ev->type() == QEvent::StyleChange) {
        d->calculateFrame();
    }
    QWidget::changeEvent(ev);
}